

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_init_finish.c
# Opt level: O0

Dwarf_Unsigned dwarf_get_section_count(Dwarf_Debug dbg)

{
  Dwarf_Obj_Access_Interface_a_s *pDVar1;
  Dwarf_Obj_Access_Interface_a_s *obj;
  Dwarf_Debug dbg_local;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    dbg_local = (Dwarf_Debug)0x0;
  }
  else {
    pDVar1 = dbg->de_obj_file;
    if (pDVar1 == (Dwarf_Obj_Access_Interface_a_s *)0x0) {
      dbg_local = (Dwarf_Debug)0x0;
    }
    else {
      dbg_local = (Dwarf_Debug)(*pDVar1->ai_methods->om_get_section_count)(pDVar1->ai_object);
    }
  }
  return (Dwarf_Unsigned)dbg_local;
}

Assistant:

Dwarf_Unsigned
dwarf_get_section_count(Dwarf_Debug dbg)
{
    struct Dwarf_Obj_Access_Interface_a_s * obj = 0;

    if (IS_INVALID_DBG(dbg)) {
        return 0;
    }
    obj = dbg->de_obj_file;
    if (!obj) {
        /*  -1  */
        return 0;
    }
    return obj->ai_methods->om_get_section_count(obj->ai_object);
}